

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

void __thiscall
option::PrintUsageImplementation::LinePartIterator::update_length(LinePartIterator *this)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint ch;
  
  this->screenlen = 0;
  iVar6 = 0;
  while( true ) {
    this->len = iVar6;
    pcVar2 = this->ptr;
    if (((byte)pcVar2[iVar6] < 0xc) && ((0xe01U >> ((byte)pcVar2[iVar6] & 0x1f) & 1) != 0)) break;
    this->screenlen = this->screenlen + 1;
    bVar1 = pcVar2[iVar6];
    if (0xc1 < bVar1) {
      uVar5 = bVar1 ^ 0xff;
      iVar6 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      ch = ((uint)bVar1 << (~(byte)iVar6 & 0x1f)) >> (~(byte)iVar6 & 0x1f);
      iVar6 = this->len;
      uVar5 = (uint)(byte)pcVar2[(long)iVar6 + 1];
      if ((byte)(pcVar2[(long)iVar6 + 1] ^ 0x80U) < 0x40) {
        pbVar4 = (byte *)(pcVar2 + (long)iVar6 + 2);
        do {
          iVar6 = iVar6 + 1;
          ch = ch << 6 ^ uVar5 ^ 0x80;
          this->len = iVar6;
          uVar5 = (uint)*pbVar4;
          pbVar4 = pbVar4 + 1;
        } while ((uVar5 ^ 0x80) < 0x40);
      }
      if (0x10ff < ch) {
        bVar3 = isWideChar(ch);
        if (bVar3) {
          this->screenlen = this->screenlen + 1;
        }
      }
    }
    iVar6 = this->len + 1;
  }
  return;
}

Assistant:

void update_length()
    {
      screenlen = 0;
      for (len = 0; ptr[len] != 0 && ptr[len] != '\v' && ptr[len] != '\t' && ptr[len] != '\n'; ++len)
      {
        ++screenlen;
        unsigned ch = static_cast<unsigned char>(ptr[len]);
        if (ch > 0xC1) // everything <= 0xC1 (yes, even 0xC1 itself) is not a valid UTF-8 start byte
        {
          // int __builtin_clz (unsigned int x)
          // Returns the number of leading 0-bits in x, starting at the most significant bit
          unsigned mask = static_cast<unsigned>(-1) >> __builtin_clz(ch ^ 0xff);
          ch = ch & mask; // mask out length bits, we don't verify their correctness
          while ((static_cast<unsigned char>(ptr[len + 1]) ^ 0x80) <= 0x3F) // while next byte is continuation byte
          {
            ch = (ch << 6) ^ static_cast<unsigned char>(ptr[len + 1]) ^ 0x80; // add continuation to char code
            ++len;
          }
          // ch is the decoded unicode code point
          if (ch >= 0x1100 && isWideChar(ch)) // the test for 0x1100 is here to avoid the function call in the Latin case
            ++screenlen;
        }
      }
    }